

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationPart.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::SeparationPart::SeparationPart
          (SeparationPart *this,ReasonForSeparation RFS,PreEntityIndicator PEI,
          EntityIdentifier *PEID,NamedLocationIdentifier *SL)

{
  NamedLocationIdentifier *SL_local;
  EntityIdentifier *PEID_local;
  PreEntityIndicator PEI_local;
  ReasonForSeparation RFS_local;
  SeparationPart *this_local;
  
  VariableParameter::VariableParameter(&this->super_VariableParameter);
  (this->super_VariableParameter).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__SeparationPart_00331d00;
  this->m_ui8Reason = (KUINT8)RFS;
  this->m_ui8PreEntIndicator = (KUINT8)PEI;
  this->m_ui8Padding = '\0';
  EntityIdentifier::EntityIdentifier(&this->m_ParentEntId,PEID);
  this->m_ui16Padding = 0;
  NamedLocationIdentifier::NamedLocationIdentifier(&this->m_StationLoc,SL);
  (this->super_VariableParameter).m_ui8VarParamType = '\x03';
  return;
}

Assistant:

KDIS::DATA_TYPE::SeparationPart::SeparationPart(ReasonForSeparation RFS, PreEntityIndicator PEI, const EntityIdentifier & PEID, const NamedLocationIdentifier & SL) :
    m_ui8Reason(RFS),
    m_ui8PreEntIndicator(PEI),
    m_ui8Padding(0),
    m_ParentEntId(PEID),
    m_ui16Padding(0),
    m_StationLoc(SL)
{
    m_ui8VarParamType = SeparationPartType;
}